

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

pid_t absl::lts_20240722::base_internal::GetCachedTID(void)

{
  pid_t pVar1;
  long lVar2;
  pid_t *ppVar3;
  
  lVar2 = __tls_get_addr(&PTR_0010cfb0);
  if (*(char *)(lVar2 + 4) == '\0') {
    pVar1 = GetTID();
    ppVar3 = (pid_t *)__tls_get_addr(&PTR_0010cfb0);
    *ppVar3 = pVar1;
    lVar2 = __tls_get_addr(&PTR_0010cfb0);
    *(undefined1 *)(lVar2 + 4) = 1;
  }
  ppVar3 = (pid_t *)__tls_get_addr(&PTR_0010cfb0);
  return *ppVar3;
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}